

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

void LockedPoolManager::CreateInstance(void)

{
  int iVar1;
  PosixLockedPageAllocator *this;
  long in_FS_OFFSET;
  PosixLockedPageAllocator *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = (PosixLockedPageAllocator *)operator_new(0x10);
  PosixLockedPageAllocator::PosixLockedPageAllocator(this);
  if (CreateInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&CreateInstance()::instance);
    if (iVar1 != 0) {
      local_20 = this;
      LockedPoolManager(&CreateInstance::instance,
                        (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>)
                        &local_20);
      if (local_20 != (PosixLockedPageAllocator *)0x0) {
        (*(local_20->super_LockedPageAllocator)._vptr_LockedPageAllocator[1])();
      }
      local_20 = (PosixLockedPageAllocator *)0x0;
      __cxa_atexit(LockedPool::~LockedPool,&CreateInstance::instance,&__dso_handle);
      __cxa_guard_release(&CreateInstance()::instance);
      _instance = &CreateInstance::instance;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
      goto LAB_007502bc;
    }
  }
  _instance = &CreateInstance::instance;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    (*(this->super_LockedPageAllocator)._vptr_LockedPageAllocator[1])(this);
    return;
  }
LAB_007502bc:
  _instance = &CreateInstance::instance;
  __stack_chk_fail();
}

Assistant:

void LockedPoolManager::CreateInstance()
{
    // Using a local static instance guarantees that the object is initialized
    // when it's first needed and also deinitialized after all objects that use
    // it are done with it.  I can think of one unlikely scenario where we may
    // have a static deinitialization order/problem, but the check in
    // LockedPoolManagerBase's destructor helps us detect if that ever happens.
#ifdef WIN32
    std::unique_ptr<LockedPageAllocator> allocator(new Win32LockedPageAllocator());
#else
    std::unique_ptr<LockedPageAllocator> allocator(new PosixLockedPageAllocator());
#endif
    static LockedPoolManager instance(std::move(allocator));
    LockedPoolManager::_instance = &instance;
}